

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMetaDataSetMetaData(FmsMetaData mdata,char *mdata_name,FmsInt size,FmsMetaData **data)

{
  int iVar1;
  int iVar2;
  FmsMetaData *__ptr;
  FmsMetaData pFVar3;
  ulong uVar4;
  bool bVar5;
  char *name_copy;
  FmsMetaData **local_38;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = FmsMetaDataClear(mdata);
    if (iVar1 == 0) {
      iVar2 = FmsCopyString(mdata_name,&name_copy);
      iVar1 = 2;
      if (iVar2 == 0) {
        if (size == 0) {
          __ptr = (FmsMetaData *)0x0;
        }
        else {
          __ptr = (FmsMetaData *)malloc(size * 8);
          if (size != 0 && __ptr == (FmsMetaData *)0x0) {
            free(name_copy);
            return 2;
          }
        }
        uVar4 = 0;
        local_38 = data;
        do {
          if (size <= uVar4) {
            mdata->name = name_copy;
            mdata->md_type = FMS_META_DATA;
            mdata->num_entries = size;
            mdata->data = __ptr;
            *local_38 = __ptr;
            return 0;
          }
          pFVar3 = (FmsMetaData)calloc(1,0x20);
          if (pFVar3 == (FmsMetaData)0x0) {
            while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
              free(__ptr[uVar4]);
            }
            free(__ptr);
            free(name_copy);
            uVar4 = 1;
          }
          else {
            __ptr[uVar4] = pFVar3;
            uVar4 = uVar4 + 1;
          }
        } while (pFVar3 != (FmsMetaData)0x0);
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetMetaData(FmsMetaData mdata, const char *mdata_name,
                           FmsInt size, FmsMetaData **data) {
  if (!mdata) { E_RETURN(1); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  char *name_copy;
  if (FmsCopyString(mdata_name, &name_copy)) { E_RETURN(2); }
  // On error, call free(name_copy)
  FmsMetaData *md_data = size ? malloc(size*sizeof(*md_data)) : NULL;
  if (size && md_data == NULL) { free(name_copy); E_RETURN(2); }
  // On error, call free(md_data)
  for (FmsInt i = 0; i < size; i++) {
    FmsMetaData md;
    md = calloc(1, sizeof(*md));
    if (md == NULL) {
      while (i != 0) { free(md_data[--i]); }
      free(md_data);
      free(name_copy);
      E_RETURN(2);
    }
    md_data[i] = md;
  }
  // Update mdata
  mdata->name = name_copy;
  mdata->md_type = FMS_META_DATA;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}